

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labels_solver.h
# Opt level: O0

uint RemSP::Merge(uint i,uint j)

{
  uint uVar1;
  uint z_1;
  uint z;
  uint root_j;
  uint root_i;
  uint j_local;
  uint i_local;
  
  z_1 = j;
  z = i;
  while( true ) {
    while( true ) {
      if (P_[z] == P_[z_1]) {
        return P_[z];
      }
      if (P_[z] <= P_[z_1]) break;
      if (z == P_[z]) {
        P_[z] = P_[z_1];
        return P_[z];
      }
      uVar1 = P_[z];
      P_[z] = P_[z_1];
      z = uVar1;
    }
    if (z_1 == P_[z_1]) break;
    uVar1 = P_[z_1];
    P_[z_1] = P_[z];
    z_1 = uVar1;
  }
  P_[z_1] = P_[z];
  return P_[z];
}

Assistant:

static unsigned Merge(unsigned i, unsigned j)
    {
        unsigned root_i(i), root_j(j);

        while (P_[root_i] != P_[root_j]) {
            if (P_[root_i] > P_[root_j]) {
                if (root_i == P_[root_i]) {
                    P_[root_i] = P_[root_j];
                    return P_[root_i];
                }
                unsigned z = P_[root_i];
                P_[root_i] = P_[root_j];
                root_i = z;
            }
            else {
                if (root_j == P_[root_j]) {
                    P_[root_j] = P_[root_i];
                    return P_[root_i];
                }
                unsigned z = P_[root_j];
                P_[root_j] = P_[root_i];
                root_j = z;
            }
        }
        return P_[root_i];
    }